

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O0

_nhr_map_node * nhr_map_last(_nhr_map_node *map)

{
  _nhr_map_node *local_20;
  _nhr_map_node *last;
  _nhr_map_node *cur;
  _nhr_map_node *map_local;
  
  local_20 = map;
  for (last = map; last != (_nhr_map_node *)0x0; last = last->next) {
    local_20 = last;
  }
  return local_20;
}

Assistant:

_nhr_map_node * nhr_map_last(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last = map;
	while (cur) {
		last = cur;
		cur = cur->next;
	}
	return last;
}